

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prime.cpp
# Opt level: O2

bool isprime(ll p)

{
  pointer plVar1;
  pointer mod;
  difference_type dVar2;
  pointer plVar3;
  int iVar4;
  int iVar5;
  pointer p_00;
  undefined1 auVar6 [8];
  bool bVar7;
  bool bVar8;
  initializer_list<long_long> __l;
  longlong local_78 [3];
  undefined1 local_60 [8];
  vector<long_long,_std::allocator<long_long>_> wit;
  ll p_local;
  allocator_type local_35;
  undefined4 local_34;
  
  local_78[0] = 2;
  local_78[1] = 7;
  local_78[2] = 0x3d;
  __l._M_len = 3;
  __l._M_array = local_78;
  wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)p;
  std::vector<long_long,_std::allocator<long_long>_>::vector
            ((vector<long_long,_std::allocator<long_long>_> *)local_60,__l,&local_35);
  dVar2 = std::
          __count_if<__gnu_cxx::__normal_iterator<long_long*,std::vector<long_long,std::allocator<long_long>>>,__gnu_cxx::__ops::_Iter_equals_val<long_long_const>>
                    ((__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                      )local_60,
                     (__normal_iterator<long_long_*,_std::vector<long_long,_std::allocator<long_long>_>_>
                      )wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_start,
                     (_Iter_equals_val<const_long_long>)
                     &wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  mod = wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  if (dVar2 == 0) {
    iVar5 = 0;
    local_34 = 0;
    if (((ulong)wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage & 1) != 0 &&
        1 < (long)wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
      plVar1 = (pointer)((long)wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage - 1);
      for (p_00 = plVar1;
          plVar3 = wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                   super__Vector_impl_data._M_start, auVar6 = local_60, ((ulong)p_00 & 1) == 0;
          p_00 = (pointer)((ulong)p_00 >> 1)) {
        iVar5 = iVar5 + 1;
      }
      do {
        dVar2 = CONCAT71((int7)((ulong)plVar3 >> 8),
                         auVar6 == (undefined1  [8])
                                   wit.super__Vector_base<long_long,_std::allocator<long_long>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
        if (auVar6 == (undefined1  [8])
                      wit.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                      super__Vector_impl_data._M_start) goto LAB_001243ed;
        local_34 = (undefined4)dVar2;
        plVar3 = (pointer)fastexp(*(ll *)auVar6,(ll)p_00,(ll)mod);
        bVar8 = plVar3 == (pointer)0x1;
        iVar4 = iVar5;
        while (bVar7 = iVar4 != 0, iVar4 = iVar4 + -1, bVar7) {
          bVar8 = (bool)(bVar8 | plVar3 == plVar1);
          plVar3 = (pointer)((ulong)((long)plVar3 * (long)plVar3) % (ulong)mod);
        }
        auVar6 = (undefined1  [8])((long)auVar6 + 8);
      } while (bVar8);
    }
  }
  else {
LAB_001243ed:
    local_34 = (undefined4)CONCAT71((int7)((ulong)dVar2 >> 8),1);
  }
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)local_60);
  return SUB41(local_34,0);
}

Assistant:

bool isprime(ll p) {
	vector<ll> wit = {2, 7, 61};
	// For p < 1e18, use 2, 3, 5, 7, 11, 13, 17, 19, 23, 29, 31, 37
	// plus KACTL mod_pow (which can multiply modulo m ≤ 1e18)
	if (count(wit.begin(), wit.end(), p))
		return true;
	if (p < 2 || !(p % 2))
		return false;
	int cnt = 0;
	ll d = p - 1;
	while (d % 2 == 0)
		d /= 2, cnt++;
	/// It's been proven testing only these witnesses suffices for all p that
	/// concern us
	for (ll a: wit) {
		bool passed = false;
		ll ad = fastexp(a, d, p);
		passed |= ad == 1;
		for (int i = 0; i < cnt; i++, ad = (ad * ad) % p)
			passed |= ad == p - 1;
		if (!passed)
			return false;
	}
	return true;
}